

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model_test.cc
# Opt level: O0

void __thiscall
NoiseStrengthLut_LutEvalSinglePoint_Test::~NoiseStrengthLut_LutEvalSinglePoint_Test
          (NoiseStrengthLut_LutEvalSinglePoint_Test *this)

{
  void *in_RDI;
  
  ~NoiseStrengthLut_LutEvalSinglePoint_Test((NoiseStrengthLut_LutEvalSinglePoint_Test *)0x5a8568);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(NoiseStrengthLut, LutEvalSinglePoint) {
  aom_noise_strength_lut_t lut;
  ASSERT_TRUE(aom_noise_strength_lut_init(&lut, 1));
  ASSERT_EQ(1, lut.num_points);
  lut.points[0][0] = 0;
  lut.points[0][1] = 1;
  EXPECT_EQ(1, aom_noise_strength_lut_eval(&lut, -1));
  EXPECT_EQ(1, aom_noise_strength_lut_eval(&lut, 0));
  EXPECT_EQ(1, aom_noise_strength_lut_eval(&lut, 1));
  aom_noise_strength_lut_free(&lut);
}